

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

void __thiscall delta_complex_t::print_complex(delta_complex_t *this,string *filename)

{
  long lVar1;
  ostream *poVar2;
  pointer pvVar3;
  long lVar4;
  int j;
  ulong uVar5;
  ulong uVar6;
  ofstream outstream;
  
  std::ofstream::ofstream((string *)&outstream);
  std::ofstream::open((string *)&outstream,(_Ios_Openmode)filename);
  pvVar3 = (this->cells).
           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)(this->cells).
                             super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18);
      uVar6 = uVar6 + 1) {
    poVar2 = std::operator<<((ostream *)&outstream,"Dim ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar4 = 0;
    uVar5 = 0;
    while( true ) {
      pvVar3 = (this->cells).
               super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar1 = *(long *)&pvVar3[uVar6].
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        ._M_impl;
      if ((ulong)(((long)*(pointer *)
                          ((long)&pvVar3[uVar6].
                                  super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                  ._M_impl + 8) - lVar1) / 0xe8) <= uVar5) break;
      delta_complex_cell_t::print_cell((delta_complex_cell_t *)(lVar1 + lVar4),&outstream);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0xe8;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&outstream);
  return;
}

Assistant:

void print_complex(std::string filename){
        std::ofstream outstream;
        outstream.open(filename);
		for(int i = 0; i < cells.size(); i++){
			outstream << "Dim " << i << std::endl;
			for(int j = 0; j < cells[i].size(); j++){
				cells[i][j].print_cell(outstream);
			}
		}
        outstream.close();
	}